

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O0

void compute_response_layer_precompute(response_layer *layer,integral_image *iimage)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 in_RSI;
  int *in_RDI;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  integral_image *unaff_retaddr;
  int j;
  int ind;
  int i;
  int lobe_mul_2_sub_1;
  int lobe_sub_1;
  int lobe_div_2;
  float inv_area_square;
  float inv_area;
  int border;
  int lobe;
  int width;
  int height;
  int filter_size;
  int step;
  bool *laplacian;
  float *response;
  int y;
  int x;
  float Dxy;
  float Dyy;
  float Dxx;
  int local_70;
  int local_6c;
  int local_68;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  lVar3 = *(long *)(in_RDI + 4);
  lVar4 = *(long *)(in_RDI + 6);
  iVar1 = in_RDI[2];
  iVar2 = in_RDI[1];
  fVar8 = 1.0 / (float)(*in_RDI * *in_RDI);
  local_6c = 0;
  for (local_68 = 0; local_68 < iVar1; local_68 = local_68 + 1) {
    for (local_70 = 0; local_70 < iVar2; local_70 = local_70 + 1) {
      fVar9 = box_integral(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                           (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
      auVar13._0_4_ =
           box_integral(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                        (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
      auVar13._4_60_ = extraout_var;
      auVar5 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar13._0_16_,ZEXT416((uint)fVar9));
      fVar9 = box_integral(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                           (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
      auVar14._0_4_ =
           box_integral(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                        (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
      auVar14._4_60_ = extraout_var_00;
      auVar6 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar14._0_16_,ZEXT416((uint)fVar9));
      fVar10 = box_integral(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                            (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
      fVar11 = box_integral(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                            (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
      fVar12 = box_integral(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                            (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
      fVar9 = box_integral(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                           (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
      fVar9 = ((fVar10 + fVar11) - fVar12) - fVar9;
      auVar7 = vfmsub213ss_fma(ZEXT416((uint)auVar6._0_4_),ZEXT416((uint)auVar5._0_4_),
                               ZEXT416((uint)(fVar9 * 0.81 * fVar9)));
      *(float *)(lVar3 + (long)local_6c * 4) = fVar8 * fVar8 * auVar7._0_4_;
      *(byte *)(lVar4 + local_6c) = (auVar5._0_4_ + auVar6._0_4_ < 0.0) - 1U & 1;
      local_6c = local_6c + 1;
    }
  }
  return;
}

Assistant:

void compute_response_layer_precompute(struct response_layer* layer, struct integral_image* iimage) {
    /*
    optimizations:
        - simplifying normalization and precomputing inv_area_square => -2 flops per loop iteration
        - precomputation of indices
    */

    float Dxx, Dyy, Dxy;
    int x, y;

    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int step = layer->step;
    int filter_size = layer->filter_size;
    int height = layer->height;
    int width = layer->width;

    int lobe = filter_size/3;
    int border = (filter_size-1)/2;
    float inv_area = 1.f/(filter_size*filter_size);

    float inv_area_square = inv_area*inv_area;

    int lobe_div_2 = lobe / 2;
    int lobe_sub_1 = lobe - 1;
    int lobe_mul_2_sub_1 = 2*lobe - 1;

    for (int i = 0, ind = 0; i < height; ++i) {
        x = i*step;
        for (int j = 0; j < width; ++j, ind++) {
            y = j*step;

            // // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx = box_integral(iimage, x - lobe_sub_1, y - border, lobe_mul_2_sub_1, filter_size)
                    - 3 * box_integral(iimage, x - lobe_sub_1, y - lobe_div_2, lobe_mul_2_sub_1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe_sub_1, filter_size, lobe_mul_2_sub_1)
                    - 3 * box_integral(iimage, x - lobe_div_2, y - lobe_sub_1, lobe, lobe_mul_2_sub_1);

            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                    + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                    - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                    - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Calculate Determinant & normalize
            response[ind] = inv_area_square*(Dxx * Dyy - 0.81f * Dxy * Dxy);

            // Calculate Laplacian (scaling does not matter as rescaling both summands keeps the sign)
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
        }
    }

}